

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valve.cpp
# Opt level: O0

bool __thiscall
Valve::changeSetting(Valve *this,double newSetting,bool makeChange,string *reason,ostream *msgLog)

{
  double *pdVar1;
  ostream *poVar2;
  ostream *msgLog_local;
  string *reason_local;
  bool makeChange_local;
  double newSetting_local;
  Valve *this_local;
  
  pdVar1 = &(this->super_Link).setting;
  if ((newSetting != *pdVar1) || (NAN(newSetting) || NAN(*pdVar1))) {
    if (makeChange) {
      this->hasFixedStatus = false;
      (this->super_Link).status = 1;
      poVar2 = std::operator<<(msgLog,"\n    ");
      std::operator<<(poVar2,(string *)reason);
      (this->super_Link).setting = newSetting;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Valve::changeSetting(
        double newSetting, bool makeChange, const string reason, ostream& msgLog)
{
    if ( newSetting != setting )
    {
        if ( makeChange )
        {
            hasFixedStatus = false;
            status = Link::LINK_OPEN;
            msgLog << "\n    " << reason;
            setting = newSetting;
        }
        return true;
    }
    return false;
}